

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall IlmThread_3_3::TaskGroup::Data::addTask(Data *this)

{
  int iVar1;
  void *in_RSI;
  int *in_RDI;
  
  LOCK();
  in_RDI[1] = in_RDI[1] + 1;
  UNLOCK();
  LOCK();
  iVar1 = *in_RDI;
  *in_RDI = *in_RDI + 1;
  UNLOCK();
  if (iVar1 == 0) {
    Semaphore::wait((Semaphore *)(in_RDI + 2),in_RSI);
  }
  return;
}

Assistant:

void
TaskGroup::Data::addTask ()
{
    inFlight.fetch_add (1);

    // if we are the first task off the rank, clear the
    // isEmpty semaphore such that the group will actually pause
    // until the task finishes
    if (numPending.fetch_add (1) == 0) { isEmpty.wait (); }
}